

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_fax3.c
# Opt level: O0

int TIFFInitCCITTFax3(TIFF *tif,int scheme)

{
  int iVar1;
  int scheme_local;
  TIFF *tif_local;
  
  iVar1 = InitCCITTFax3(tif);
  if (iVar1 == 0) {
    tif_local._4_4_ = 1;
  }
  else {
    iVar1 = _TIFFMergeFields(tif,fax3Fields,1);
    if (iVar1 == 0) {
      TIFFErrorExtR(tif,"TIFFInitCCITTFax3","Merging CCITT Fax 3 codec-specific tags failed");
      tif_local._4_4_ = 0;
    }
    else {
      tif_local._4_4_ = TIFFSetField(tif,0x10000,1);
    }
  }
  return tif_local._4_4_;
}

Assistant:

int TIFFInitCCITTFax3(TIFF *tif, int scheme)
{
    (void)scheme;
    if (InitCCITTFax3(tif))
    {
        /*
         * Merge codec-specific tag information.
         */
        if (!_TIFFMergeFields(tif, fax3Fields, TIFFArrayCount(fax3Fields)))
        {
            TIFFErrorExtR(tif, "TIFFInitCCITTFax3",
                          "Merging CCITT Fax 3 codec-specific tags failed");
            return 0;
        }

        /*
         * The default format is Class/F-style w/o RTC.
         */
        return TIFFSetField(tif, TIFFTAG_FAXMODE, FAXMODE_CLASSF);
    }
    else
        return 01;
}